

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O2

void __thiscall
GrcManager::CreateAutoPseudoGlyphDefn(GrcManager *this,utf16 wAssigned,int nUnicode,gid16 wGlyphID)

{
  GdlGlyphDefn *this_00;
  GdlGlyphDefn *this_01;
  GdlGlyphClassDefn *this_02;
  undefined6 in_register_0000000a;
  utf16 wAssigned_local;
  uint local_54;
  GrpLineAndFile lnf;
  
  wAssigned_local = wAssigned;
  this_00 = (GdlGlyphDefn *)operator_new(0xb0);
  GdlGlyphDefn::GdlGlyphDefn(this_00,kglftGlyphID,(int)CONCAT62(in_register_0000000a,wGlyphID));
  this_01 = (GdlGlyphDefn *)operator_new(0xb0);
  GdlGlyphDefn::GdlGlyphDefn(this_01,kglftPseudo,this_00,nUnicode);
  this_01->m_wPseudo = wAssigned;
  this_02 = (GdlGlyphClassDefn *)operator_new(0x110);
  GdlGlyphClassDefn::GdlGlyphClassDefn(this_02);
  lnf.m_nLinePre = -1;
  lnf.m_nLineOrig = -1;
  lnf.m_staFile._M_dataplus._M_p = (pointer)&lnf.m_staFile.field_2;
  lnf.m_staFile._M_string_length = 0;
  lnf.m_staFile.field_2._M_local_buf[0] = '\0';
  GdlGlyphClassDefn::AddMember(this_02,(GdlGlyphClassMember *)this_01,&lnf);
  GdlRenderer::AddGlyphClass(this->m_prndr,this_02);
  local_54 = nUnicode;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&this->m_vnUnicodeForPseudo,&local_54);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
            (&this->m_vwPseudoForUnicode,&wAssigned_local);
  std::__cxx11::string::~string((string *)&lnf.m_staFile);
  return;
}

Assistant:

void GrcManager::CreateAutoPseudoGlyphDefn(utf16 wAssigned, int nUnicode, gid16 wGlyphID)
{
	GdlGlyphDefn * pglfOutput = new GdlGlyphDefn(kglftGlyphID, wGlyphID);
	GdlGlyphDefn * pglf = new GdlGlyphDefn(kglftPseudo, pglfOutput, nUnicode);
	pglf->SetAssignedPseudo(wAssigned);

	GdlGlyphClassDefn * pglfc = new GdlGlyphClassDefn();
	GrpLineAndFile lnf;	// bogus
	pglfc->AddMember(pglf, lnf);
	m_prndr->AddGlyphClass(pglfc);
	
	m_vnUnicodeForPseudo.push_back(nUnicode);
	m_vwPseudoForUnicode.push_back(wAssigned);
}